

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool __thiscall
duckdb::StringValueResult::HandleTooManyColumnsError
          (StringValueResult *this,char *value_ptr,idx_t size)

{
  CSVStateMachine *pCVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  bool bVar7;
  CSVErrorType local_11;
  
  if ((this->cur_col_id < (ulong)this->number_of_columns) ||
     (pCVar1 = (this->super_ScannerResult).state_machine,
     (pCVar1->state_machine_options).strict_mode.value != true)) {
    bVar7 = false;
  }
  else {
    if ((this->cur_col_id == (ulong)this->number_of_columns) &&
       ((((this->super_ScannerResult).quoted != true ||
         (pCVar1->options->allow_quoted_nulls != false)) && (this->null_str_count != 0)))) {
      iVar5 = 0;
      bVar7 = false;
      do {
        bVar3 = !bVar7;
        bVar7 = true;
        if (((bVar3) && (bVar7 = size == 0, size != 0)) &&
           (pcVar2 = (this->null_str_ptr).
                     super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar5],
           *pcVar2 == *value_ptr)) {
          uVar4 = 1;
          do {
            uVar6 = uVar4;
            if (size == uVar6) break;
            uVar4 = uVar6 + 1;
          } while (pcVar2[uVar6] == value_ptr[uVar6]);
          bVar7 = size <= uVar6;
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != this->null_str_count);
      if (bVar7) {
        return true;
      }
    }
    LineError::Insert(&this->current_errors,&local_11,&this->cur_col_id,&this->chunk_col_id,
                      &(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool StringValueResult::HandleTooManyColumnsError(const char *value_ptr, const idx_t size) {
	if (cur_col_id >= number_of_columns && state_machine.state_machine_options.strict_mode.GetValue()) {
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		// We had an error
		return true;
	}
	return false;
}